

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  byte *__s2;
  uchar uVar2;
  time_t tVar3;
  int iVar4;
  char *pcVar5;
  byte bVar6;
  char *pcVar7;
  byte bVar8;
  byte bVar9;
  
  tVar3 = time((time_t *)0x0);
  srandom((uint)tVar3);
  memset(&greatest_info,0,0x170);
  greatest_info.width = 0x48;
  greatest_info.begin = clock();
  if (greatest_info.begin == -1) {
    pcVar5 = "greatest_info.begin";
LAB_00106e75:
    fprintf(_stdout,"clock error: %s\n",pcVar5);
LAB_00106e7c:
    exit(1);
  }
  if (1 < argc) {
    iVar4 = 1;
    bVar9 = 0x68;
    uVar2 = greatest_info.verbosity;
    bVar6 = greatest_info.flags;
    do {
      __s2 = (byte *)argv[iVar4];
      bVar1 = *__s2;
      if (bVar1 != 0x2d) {
        bVar9 = 0x2d;
        bVar8 = bVar1;
LAB_00106c60:
        if ((bVar9 == bVar8) || (iVar4 = strncmp("--help",(char *)__s2,6), iVar4 == 0)) {
          greatest_usage(*argv);
          exit(0);
        }
        if ((bVar1 != 0x2d) || (__s2[1] != 0x2d)) {
          fprintf(_stdout,"Unknown argument \'%s\'\n",__s2);
LAB_00106e5d:
          greatest_usage(*argv);
          goto LAB_00106e7c;
        }
        break;
      }
      bVar8 = __s2[1];
      if (bVar8 < 0x73) {
        if (bVar8 == 0x66) {
          bVar6 = bVar6 | 1;
          greatest_info.flags = bVar6;
        }
        else {
          if (bVar8 != 0x6c) goto LAB_00106c60;
          bVar6 = bVar6 | 2;
          greatest_info.flags = bVar6;
        }
      }
      else if (bVar8 == 0x73) {
        iVar4 = iVar4 + 1;
        if (argc <= iVar4) goto LAB_00106e5d;
        greatest_info.suite_filter = argv[iVar4];
      }
      else if (bVar8 == 0x76) {
        uVar2 = uVar2 + '\x01';
        greatest_info.verbosity = uVar2;
      }
      else {
        if (bVar8 != 0x74) goto LAB_00106c60;
        iVar4 = iVar4 + 1;
        if (argc <= iVar4) goto LAB_00106e5d;
        greatest_info.test_filter = argv[iVar4];
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < argc);
  }
  greatest_run_suite(generic_pack_unpack_le,"generic_pack_unpack_le");
  greatest_run_suite(generic_pack_unpack_be,"generic_pack_unpack_be");
  greatest_run_suite(generic_mixed_endian,"generic_mixed_endian");
  greatest_run_suite(plan,"plan");
  if ((greatest_info.flags & 2) == 0) {
    greatest_info.teardown = (undefined1 *)0x0;
    greatest_info.teardown_udata = (void *)0x0;
    greatest_info.setup = (undefined1 *)0x0;
    greatest_info.setup_udata = (void *)0x0;
    greatest_info.tests_run = greatest_info.tests_run + greatest_info.suite.tests_run;
    greatest_info.passed = greatest_info.passed + greatest_info.suite.passed;
    greatest_info.failed = greatest_info.failed + greatest_info.suite.failed;
    greatest_info.skipped = greatest_info.skipped + greatest_info.suite.skipped;
    greatest_info.suite.tests_run = 0;
    greatest_info.suite.passed = 0;
    greatest_info.suite.failed = 0;
    greatest_info.suite.skipped = 0;
    greatest_info.suite.pre_suite = 0;
    greatest_info.suite.post_suite = 0;
    greatest_info.suite.pre_test = 0;
    greatest_info.suite.post_test = 0;
    greatest_info.col = 0;
    greatest_info.end = clock();
    if (greatest_info.end == -1) {
      pcVar5 = "greatest_info.end";
      greatest_info.end = -1;
      goto LAB_00106e75;
    }
    pcVar7 = "s";
    pcVar5 = "s";
    if (greatest_info.tests_run == 1) {
      pcVar5 = "";
    }
    fprintf(_stdout,"\nTotal: %u test%s",(ulong)greatest_info.tests_run,pcVar5);
    fprintf(_stdout," (%lu ticks, %.3f sec)",
            SUB84((double)(greatest_info.end - greatest_info.begin) / 1000000.0,0));
    if (greatest_info.assertions == 1) {
      pcVar7 = "";
    }
    fprintf(_stdout,", %u assertion%s\n",(ulong)greatest_info.assertions,pcVar7);
    fprintf(_stdout,"Pass: %u, fail: %u, skip: %u.\n",(ulong)greatest_info.passed,
            (ulong)greatest_info.failed,(ulong)greatest_info.skipped);
  }
  return (int)(greatest_info.failed != 0);
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}